

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O0

ValueHashTable<Sym_*,_Value_*> * __thiscall
ValueHashTable<Sym_*,_Value_*>::Copy(ValueHashTable<Sym_*,_Value_*> *this)

{
  ValueHashTable<Sym_*,_Value_*> *pVVar1;
  DictionaryStats *pDVar2;
  uint local_1c;
  uint i;
  ValueHashTable<Sym_*,_Value_*> *newTable;
  ValueHashTable<Sym_*,_Value_*> *this_local;
  
  pVVar1 = New(this->alloc,this->tableSize);
  for (local_1c = 0; local_1c < this->tableSize; local_1c = local_1c + 1) {
    SListBase<HashBucket<Sym*,Value*>,Memory::ArenaAllocator,RealCount>::
    CopyTo<&HashBucket<Sym*,Value*>::Copy>
              ((SListBase<HashBucket<Sym*,Value*>,Memory::ArenaAllocator,RealCount> *)
               (this->table + local_1c),&this->alloc->super_ArenaAllocator,pVVar1->table + local_1c)
    ;
  }
  if (this->stats != (DictionaryStats *)0x0) {
    pDVar2 = DictionaryStats::Clone(this->stats);
    pVVar1->stats = pDVar2;
  }
  return pVVar1;
}

Assistant:

ValueHashTable *Copy()
    {
        ValueHashTable *newTable = ValueHashTable::New(this->alloc, this->tableSize);

        for (uint i = 0; i < this->tableSize; i++)
        {
            this->table[i].template CopyTo<HashBucket::Copy>(this->alloc, newTable->table[i]);
        }
#if PROFILE_DICTIONARY
        if (stats)
            newTable->stats = stats->Clone();
#endif
        return newTable;
    }